

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

ValueFederate * getValueFed(HelicsFederate fed,HelicsError *err)

{
  uint *puVar1;
  ValueFederate *pVVar2;
  bool bVar3;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fed == (HelicsFederate)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019fc68;
    }
    else {
      bVar3 = *(int *)((long)fed + 8) == 0x2352188;
      puVar1 = (uint *)0x0;
      if (bVar3) {
        puVar1 = (uint *)fed;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_0019fc6a;
    }
    err->error_code = -3;
    err->message = "federate object is not valid";
  }
LAB_0019fc68:
  puVar1 = (uint *)0x0;
LAB_0019fc6a:
  if (puVar1 != (uint *)0x0) {
    if ((*puVar1 < 5) && ((0x1aU >> (*puVar1 & 0x1f) & 1) != 0)) {
      if (*(long *)(puVar1 + 4) == 0) {
        pVVar2 = (ValueFederate *)0x0;
      }
      else {
        pVVar2 = (ValueFederate *)
                 __dynamic_cast(*(long *)(puVar1 + 4),&helics::Federate::typeinfo,
                                &helics::ValueFederate::typeinfo,0xffffffffffffffff);
      }
      if (err == (HelicsError *)0x0) {
        return pVVar2;
      }
      if (pVVar2 != (ValueFederate *)0x0) {
        return pVVar2;
      }
    }
    else if (err == (HelicsError *)0x0) {
      return (ValueFederate *)0x0;
    }
    err->error_code = -3;
    err->message = "Federate must be a value federate";
  }
  return (ValueFederate *)0x0;
}

Assistant:

helics::ValueFederate* getValueFed(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::VALUE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto* rval = dynamic_cast<helics::ValueFederate*>(fedObj->fedptr.get());
        if (rval != nullptr) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notValueFedString);
    return nullptr;
}